

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random.c
# Opt level: O0

void mi_random_init_ex(mi_random_ctx_t *ctx,_Bool use_weak)

{
  _Bool _Var1;
  byte in_SIL;
  long in_RDI;
  size_t i;
  uintptr_t x;
  uint8_t key [32];
  ulong local_48;
  uintptr_t local_40;
  undefined4 local_38 [2];
  uint64_t in_stack_ffffffffffffffd0;
  uint8_t *in_stack_ffffffffffffffd8;
  mi_random_ctx_t *in_stack_ffffffffffffffe0;
  void *in_stack_ffffffffffffffe8;
  
  if ((in_SIL & 1) == 0) {
    _Var1 = _mi_prim_random_buf(in_stack_ffffffffffffffe8,(size_t)in_stack_ffffffffffffffe0);
    if (_Var1) {
      *(undefined1 *)(in_RDI + 0x84) = 0;
      goto LAB_00ae7af2;
    }
  }
  if ((in_SIL & 1) == 0) {
    _mi_warning_message("unable to use secure randomness\n");
  }
  local_40 = _mi_os_random_weak(in_stack_ffffffffffffffd0);
  for (local_48 = 0; local_48 < 8; local_48 = local_48 + 1) {
    local_40 = _mi_random_shuffle(local_40);
    local_38[local_48] = (int)local_40;
    local_40 = local_40 + 1;
  }
  *(undefined1 *)(in_RDI + 0x84) = 1;
LAB_00ae7af2:
  chacha_init(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
  return;
}

Assistant:

static void mi_random_init_ex(mi_random_ctx_t* ctx, bool use_weak) {
  uint8_t key[32];
  if (use_weak || !_mi_prim_random_buf(key, sizeof(key))) {
    // if we fail to get random data from the OS, we fall back to a
    // weak random source based on the current time
    #if !defined(__wasi__)
    if (!use_weak) { _mi_warning_message("unable to use secure randomness\n"); }
    #endif
    uintptr_t x = _mi_os_random_weak(0);
    for (size_t i = 0; i < 8; i++, x++) {  // key is eight 32-bit words.
      x = _mi_random_shuffle(x);
      ((uint32_t*)key)[i] = (uint32_t)x;
    }
    ctx->weak = true;
  }
  else {
    ctx->weak = false;
  }
  chacha_init(ctx, key, (uintptr_t)ctx /*nonce*/ );
}